

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void stbi__de_iphone(stbi__png *z)

{
  undefined1 uVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  undefined1 *in_RSI;
  stbi__context *s;
  long lVar5;
  ushort uVar6;
  uint uVar7;
  
  iVar4 = *(int *)((long)&z->s + 4) * *(int *)&z->s;
  if (*(int *)((long)&z->idata + 4) == 3) {
    for (; iVar4 != 0; iVar4 = iVar4 + -1) {
      uVar1 = *in_RSI;
      *in_RSI = in_RSI[2];
      in_RSI[2] = uVar1;
      in_RSI = in_RSI + 3;
    }
  }
  else if (stbi__unpremultiply_on_load == 0) {
    if (iVar4 != 0) {
      lVar5 = 0;
      do {
        uVar1 = in_RSI[lVar5 * 4];
        in_RSI[lVar5 * 4] = in_RSI[lVar5 * 4 + 2];
        in_RSI[lVar5 * 4 + 2] = uVar1;
        lVar5 = lVar5 + 1;
      } while (iVar4 != (int)lVar5);
    }
  }
  else if (iVar4 != 0) {
    lVar5 = 0;
    do {
      bVar2 = in_RSI[lVar5 * 4 + 3];
      bVar3 = in_RSI[lVar5 * 4];
      if (bVar2 == 0) {
        in_RSI[lVar5 * 4] = in_RSI[lVar5 * 4 + 2];
        in_RSI[lVar5 * 4 + 2] = bVar3;
      }
      else {
        uVar7 = (uint)(bVar2 >> 1);
        uVar6 = (ushort)bVar2;
        in_RSI[lVar5 * 4] =
             (char)((((uint)(byte)in_RSI[lVar5 * 4 + 2] * 0x100 - (uint)(byte)in_RSI[lVar5 * 4 + 2])
                     + uVar7 & 0xffff) / (uint)uVar6);
        in_RSI[lVar5 * 4 + 1] =
             (char)((((uint)(byte)in_RSI[lVar5 * 4 + 1] * 0x100 - (uint)(byte)in_RSI[lVar5 * 4 + 1])
                     + uVar7 & 0xffff) / (uint)uVar6);
        in_RSI[lVar5 * 4 + 2] =
             (char)((((uint)bVar3 * 0x100 - (uint)bVar3) + uVar7 & 0xffff) / (uint)uVar6);
      }
      lVar5 = lVar5 + 1;
    } while (iVar4 != (int)lVar5);
  }
  return;
}

Assistant:

static void stbi__de_iphone(stbi__png *z)
{
   stbi__context *s = z->s;
   stbi__uint32 i, pixel_count = s->img_x * s->img_y;
   stbi_uc *p = z->out;

   if (s->img_out_n == 3) {  // convert bgr to rgb
      for (i=0; i < pixel_count; ++i) {
         stbi_uc t = p[0];
         p[0] = p[2];
         p[2] = t;
         p += 3;
      }
   } else {
      STBI_ASSERT(s->img_out_n == 4);
      if (stbi__unpremultiply_on_load) {
         // convert bgr to rgb and unpremultiply
         for (i=0; i < pixel_count; ++i) {
            stbi_uc a = p[3];
            stbi_uc t = p[0];
            if (a) {
               stbi_uc half = a / 2;
               p[0] = (p[2] * 255 + half) / a;
               p[1] = (p[1] * 255 + half) / a;
               p[2] = ( t   * 255 + half) / a;
            } else {
               p[0] = p[2];
               p[2] = t;
            }
            p += 4;
         }
      } else {
         // convert bgr to rgb
         for (i=0; i < pixel_count; ++i) {
            stbi_uc t = p[0];
            p[0] = p[2];
            p[2] = t;
            p += 4;
         }
      }
   }
}